

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleCreateLinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  size_type sVar5;
  cmArgumentParser<Arguments> *pcVar6;
  reference __rhs;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  static_string_view sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  bool local_399;
  undefined1 local_398 [7];
  bool completed;
  string local_378 [32];
  string local_358 [32];
  undefined1 local_338 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_118;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_108;
  undefined1 local_f8 [8];
  Arguments arguments;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmArgumentParser<Arguments> local_88;
  const_reference local_68;
  string *newFileName;
  string *fileName;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "CREATE_LINK must be called with at least two additional arguments",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_003eb0d0;
  }
  newFileName = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](local_20,1);
  local_68 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_20,2);
  if ((HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::parser == '\0') &&
     (iVar4 = __cxa_guard_acquire(&HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser), iVar4 != 0)) {
    local_88.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_88);
    sVar10 = ::cm::operator____s("RESULT",6);
    pcVar6 = cmArgumentParser<cmFileCommand::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
             ::Bind<std::__cxx11::string>
                       ((cmArgumentParser<cmFileCommand::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                         *)&local_88,sVar10,0);
    sVar10 = ::cm::operator____s("COPY_ON_ERROR",0xd);
    pcVar6 = cmArgumentParser<Arguments>::Bind<bool>(pcVar6,sVar10,0x20);
    sVar10 = ::cm::operator____s("SYMBOLIC",8);
    pcVar6 = cmArgumentParser<Arguments>::Bind<bool>(pcVar6,sVar10,0x21);
    cmArgumentParser<Arguments>::cmArgumentParser(&HandleCreateLinkCommand::parser,pcVar6);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_88);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleCreateLinkCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&arguments.CopyOnError);
  local_118 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (local_20);
  local_108 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance(&local_118,3);
  cmArgumentParser<cmFileCommand::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_f8,
             (cmArgumentParser<cmFileCommand::HandleCreateLinkCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)&HandleCreateLinkCommand::parser,&local_108,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&arguments.CopyOnError,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&arguments.CopyOnError);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_180);
    _Var3 = std::operator==(newFileName,local_68);
    if (_Var3) {
      std::__cxx11::string::operator=
                ((string *)local_180,"CREATE_LINK cannot use same file and newfile");
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_f8,pcVar8);
        this_local._7_1_ = 1;
        result.field_2._12_4_ = 1;
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)local_180);
        this_local._7_1_ = 0;
        result.field_2._12_4_ = 1;
      }
    }
    else {
      if ((arguments.Result.field_2._M_local_buf[9] & 1U) == 0) {
        bVar2 = cmsys::SystemTools::FileExists(newFileName);
        if (!bVar2) {
          std::operator+(&local_1c0,"Cannot hard link \'",newFileName);
          std::operator+(&local_1a0,&local_1c0,"\' as it does not exist.");
          std::__cxx11::string::operator=((string *)local_180,(string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(pcVar1,(string *)local_f8,pcVar8);
            this_local._7_1_ = 1;
            result.field_2._12_4_ = 1;
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,(string *)local_180);
            this_local._7_1_ = 0;
            result.field_2._12_4_ = 1;
          }
          goto LAB_003eb080;
        }
      }
      bVar2 = cmsys::SystemTools::FileExists(local_68);
      if (bVar2) {
LAB_003eac8e:
        bVar2 = cmsys::SystemTools::RemoveFile(local_68);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
          poVar9 = std::operator<<((ostream *)local_338,"Failed to create link \'");
          poVar9 = std::operator<<(poVar9,(string *)local_68);
          poVar9 = std::operator<<(poVar9,"\' because existing path cannot be removed: ");
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          poVar9 = std::operator<<(poVar9,local_358);
          std::operator<<(poVar9,"\n");
          std::__cxx11::string::~string(local_358);
          uVar7 = std::__cxx11::string::empty();
          bVar2 = (uVar7 & 1) != 0;
          if (bVar2) {
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_398);
            std::__cxx11::string::~string((string *)local_398);
          }
          else {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(pcVar1,(string *)local_f8,pcVar8);
            std::__cxx11::string::~string(local_378);
          }
          this_local._7_1_ = !bVar2;
          result.field_2._12_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
          goto LAB_003eb080;
        }
      }
      else {
        bVar2 = cmsys::SystemTools::FileIsSymlink(local_68);
        if (bVar2) goto LAB_003eac8e;
      }
      local_399 = false;
      if ((arguments.Result.field_2._M_local_buf[9] & 1U) == 0) {
        local_399 = cmSystemTools::CreateLink(newFileName,local_68,(string *)local_180);
      }
      else {
        local_399 = cmSystemTools::CreateSymlink(newFileName,local_68,(string *)local_180);
      }
      if ((local_399 == false) && ((arguments.Result.field_2._M_local_buf[8] & 1U) != 0)) {
        local_399 = cmsys::SystemTools::CopyFileAlways(newFileName,local_68);
        if (!local_399) {
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          std::operator+(&local_3c0,"Copy failed: ",&local_3e0);
          std::__cxx11::string::operator=((string *)local_180,(string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
        }
      }
      if ((local_399 & 1U) == 0) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          cmCommand::SetError(&this->super_cmCommand,(string *)local_180);
          this_local._7_1_ = 0;
          result.field_2._12_4_ = 1;
          goto LAB_003eb080;
        }
      }
      else {
        std::__cxx11::string::operator=((string *)local_180,"0");
      }
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_f8,pcVar8);
      }
      this_local._7_1_ = 1;
      result.field_2._12_4_ = 1;
    }
LAB_003eb080:
    std::__cxx11::string::~string((string *)local_180);
  }
  else {
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&arguments.CopyOnError);
    std::operator+(&local_158,"unknown argument: \"",__rhs);
    std::operator+(&local_138,&local_158,'\"');
    cmCommand::SetError(&this->super_cmCommand,&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    this_local._7_1_ = 0;
    result.field_2._12_4_ = 1;
  }
  HandleCreateLinkCommand::Arguments::~Arguments((Arguments *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&arguments.CopyOnError);
LAB_003eb0d0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleCreateLinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("CREATE_LINK must be called with at least two additional "
                   "arguments");
    return false;
  }

  std::string const& fileName = args[1];
  std::string const& newFileName = args[2];

  struct Arguments
  {
    std::string Result;
    bool CopyOnError = false;
    bool Symbolic = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESULT"_s, &Arguments::Result)
      .Bind("COPY_ON_ERROR"_s, &Arguments::CopyOnError)
      .Bind("SYMBOLIC"_s, &Arguments::Symbolic);

  std::vector<std::string> unconsumedArgs;
  Arguments const arguments =
    parser.Parse(cmMakeRange(args).advance(3), &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    this->SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!arguments.Symbolic && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!arguments.Result.empty()) {
      this->Makefile->AddDefinition(arguments.Result, e.str().c_str());
      return true;
    }
    this->SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (arguments.Symbolic) {
    completed = cmSystemTools::CreateSymlink(fileName, newFileName, &result);
  } else {
    completed = cmSystemTools::CreateLink(fileName, newFileName, &result);
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && arguments.CopyOnError) {
    completed = cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (!completed) {
      result = "Copy failed: " + cmSystemTools::GetLastSystemError();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (arguments.Result.empty()) {
    // The operation failed and the result is not reported in a variable.
    this->SetError(result);
    return false;
  }

  if (!arguments.Result.empty()) {
    this->Makefile->AddDefinition(arguments.Result, result.c_str());
  }

  return true;
}